

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase109::run(TestCase109 *this)

{
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  undefined4 uVar11;
  char *__n;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ReaderFor<capnp::Data> RVar15;
  BuilderFor<capnp::Data> BVar16;
  char *local_380;
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  uint local_358;
  Builder sb;
  uint local_31c;
  Builder root;
  DebugComparison<int,_unsigned_long> _kjCondition_15;
  DebugComparison<int,_int> _kjCondition;
  uint local_288;
  ushort local_284;
  bool local_280;
  bool local_278;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_1a0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_178;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_150;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  _kjCondition._0_8_ = root._builder.segment;
  _kjCondition.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition.op.content.size_ = (size_t)root._builder.pointers;
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_178,(Builder *)&_kjCondition);
  builder_00._builder.capTable = local_178._builder.capTable;
  builder_00._builder.segment = local_178._builder.segment;
  builder_00._builder.data = local_178._builder.data;
  builder_00._builder.pointers = local_178._builder.pointers;
  builder_00._builder.dataSize = local_178._builder.dataSize;
  builder_00._builder.pointerCount = local_178._builder.pointerCount;
  builder_00._builder._38_2_ = local_178._builder._38_2_;
  initTestMessage(builder_00);
  _kjCondition._0_8_ = root._builder.segment;
  _kjCondition.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition.op.content.size_ = (size_t)root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_1a0,(Builder *)&_kjCondition);
  builder_01._builder.capTable = local_1a0._builder.capTable;
  builder_01._builder.segment = local_1a0._builder.segment;
  builder_01._builder.data = local_1a0._builder.data;
  builder_01._builder.pointers = local_1a0._builder.pointers;
  builder_01._builder.dataSize = local_1a0._builder.dataSize;
  builder_01._builder.pointerCount = local_1a0._builder.pointerCount;
  builder_01._builder._38_2_ = local_1a0._builder._38_2_;
  checkTestMessage(builder_01);
  StructBuilder::asReader(&root._builder);
  bVar12 = local_284 != 0;
  _kjCondition_2.op.content.size_ = 0;
  if (bVar12) {
    _kjCondition_2.op.content.size_ = _kjCondition._24_8_;
  }
  uVar11._0_1_ = true;
  uVar11._1_3_ = 0x7fffff;
  if (bVar12) {
    uVar11 = _local_280;
  }
  _kjCondition_2.left = 0;
  _kjCondition_2.right = 0;
  uVar13 = 0;
  uVar14 = 0;
  if (bVar12) {
    _kjCondition_2.left = _kjCondition.left;
    _kjCondition_2.right = _kjCondition.right;
    uVar13 = _kjCondition.op.content.ptr._0_4_;
    uVar14 = _kjCondition.op.content.ptr._4_4_;
  }
  _kjCondition_2.op.content.ptr = (char *)CONCAT44(uVar14,uVar13);
  _kjCondition_2.result = SUB41(uVar11,0);
  _kjCondition_2._25_3_ = SUB43(uVar11,1);
  AnyPointer::Reader::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_150,(Reader *)&_kjCondition_2);
  reader._reader.capTable = local_150._reader.capTable;
  reader._reader.segment = local_150._reader.segment;
  reader._reader.data = local_150._reader.data;
  reader._reader.pointers = local_150._reader.pointers;
  reader._reader.dataSize = local_150._reader.dataSize;
  reader._reader.pointerCount = local_150._reader.pointerCount;
  reader._reader._38_2_ = local_150._reader._38_2_;
  reader._reader.nestingLimit = local_150._reader.nestingLimit;
  reader._reader._44_4_ = local_150._reader._44_4_;
  checkTestMessage(reader);
  _kjCondition_2._0_8_ = root._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_2.op.content.size_ = (size_t)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::AnyStruct>
            ((BuilderFor<capnp::AnyStruct> *)&_kjCondition,(Builder *)&_kjCondition_2);
  sVar6 = _kjCondition.op.content.size_;
  sb._builder.capTable = root._builder.capTable;
  sb._builder.segment = root._builder.segment;
  sb._builder.data = root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::AnyStruct>
            ((BuilderFor<capnp::AnyStruct> *)&_kjCondition_2,(Builder *)&sb);
  StructBuilder::asReader((StructBuilder *)&_kjCondition_2);
  sVar7 = _kjCondition.op.content.size_;
  *(undefined4 *)(sVar6 + 4) = 100;
  _kjCondition.right = 0;
  if (0x3f < local_288) {
    _kjCondition.right = *(int *)(_kjCondition.op.content.size_ + 4);
  }
  _kjCondition.left = 100;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 100;
  if ((_kjCondition.right != 100) && (kj::_::Debug::minSeverity < 3)) {
    sb._builder.segment._0_4_ = 0;
    _kjCondition_2.left = 100;
    if (0x3f < local_288) {
      sb._builder.segment._0_4_ = *(undefined4 *)(sVar7 + 4);
    }
    kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"(100) == (allTypesReader.getInt32Field())\", _kjCondition, 100, allTypesReader.getInt32Field()"
               ,(char (*) [59])"failed: expected (100) == (allTypesReader.getInt32Field())",
               &_kjCondition,(int *)&_kjCondition_2,(int *)&sb);
  }
  sb._builder.data = root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::AnyStruct>
            ((BuilderFor<capnp::AnyStruct> *)&_kjCondition_2,(Builder *)&sb);
  uVar10 = local_358 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar10;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b08b;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_288 = CONCAT31(local_288._1_3_,uVar10 == 0x30);
  if ((uVar10 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_380 = (char *)CONCAT44(local_380._4_4_,0x30);
    sb._builder.data = root._builder.pointers;
    AnyPointer::Builder::getAs<capnp::AnyStruct>
              ((BuilderFor<capnp::AnyStruct> *)&_kjCondition_2,(Builder *)&sb);
    _kjCondition_15._4_4_ = 0;
    _kjCondition_15.left = local_358 >> 3;
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"(48) == (root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size())\", _kjCondition, 48, root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size()"
               ,(char (*) [96])
                "failed: expected (48) == (root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size())"
               ,(DebugComparison<int,_unsigned_long> *)&_kjCondition,(int *)&local_380,
               (unsigned_long *)&_kjCondition_15);
  }
  sb._builder.capTable = root._builder.capTable;
  sb._builder.segment = root._builder.segment;
  sb._builder.data = root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::AnyStruct>
            ((BuilderFor<capnp::AnyStruct> *)&_kjCondition,(Builder *)&sb);
  _kjCondition_2.right._0_2_ = local_284;
  _kjCondition_2.left = 0x14;
  _kjCondition_2.right._2_2_ = 0;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  _kjCondition_2.result = local_284 == 0x14;
  if ((local_284 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_15.left = 0x14;
    sb._builder.capTable = root._builder.capTable;
    sb._builder.segment = root._builder.segment;
    sb._builder.data = root._builder.pointers;
    AnyPointer::Builder::getAs<capnp::AnyStruct>
              ((BuilderFor<capnp::AnyStruct> *)&_kjCondition,(Builder *)&sb);
    local_380 = (char *)CONCAT44(local_380._4_4_,(uint)local_284);
    kj::_::Debug::log<char_const(&)[99],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"(20) == (root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size())\", _kjCondition, 20, root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size()"
               ,(char (*) [99])
                "failed: expected (20) == (root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size())"
               ,&_kjCondition_2,&_kjCondition_15.left,(uint *)&local_380);
  }
  _kjCondition_15.op.content.ptr = (char *)root._builder.pointers;
  PointerBuilder::asReader((PointerBuilder *)&_kjCondition_15);
  AnyPointer::Reader::getAs<capnp::AnyStruct>
            ((ReaderFor<capnp::AnyStruct> *)&_kjCondition,(Reader *)&sb);
  _kjCondition_2.op.content.ptr = (char *)(ulong)(local_288 >> 3);
  _kjCondition_2.left = 0x30;
  _kjCondition_2.op.content.size_ = (size_t)anon_var_dwarf_b08b;
  _kjCondition_2.result = true;
  _kjCondition_2._25_7_ = 0;
  if ((local_288 >> 3 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_31c = 0x30;
    _kjCondition_15.op.content.ptr = (char *)root._builder.pointers;
    PointerBuilder::asReader((PointerBuilder *)&_kjCondition_15);
    AnyPointer::Reader::getAs<capnp::AnyStruct>
              ((ReaderFor<capnp::AnyStruct> *)&_kjCondition,(Reader *)&sb);
    local_380 = (char *)(ulong)(local_288 >> 3);
    kj::_::Debug::
    log<char_const(&)[107],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x7e,ERROR,
               "\"failed: expected \" \"(48) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size())\", _kjCondition, 48, root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size()"
               ,(char (*) [107])
                "failed: expected (48) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size())"
               ,(DebugComparison<int,_unsigned_long> *)&_kjCondition_2,(int *)&local_31c,
               (unsigned_long *)&local_380);
  }
  _kjCondition_15.op.content.ptr = (char *)root._builder.pointers;
  PointerBuilder::asReader((PointerBuilder *)&_kjCondition_15);
  AnyPointer::Reader::getAs<capnp::AnyStruct>
            ((ReaderFor<capnp::AnyStruct> *)&_kjCondition,(Reader *)&sb);
  _kjCondition_2.left = 0x14;
  _kjCondition_2.right._2_2_ = 0;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  _kjCondition_2.result = local_284 == 0x14;
  if ((local_284 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_380 = (char *)CONCAT44(local_380._4_4_,0x14);
    _kjCondition_15.op.content.ptr = (char *)root._builder.pointers;
    PointerBuilder::asReader((PointerBuilder *)&_kjCondition_15);
    AnyPointer::Reader::getAs<capnp::AnyStruct>
              ((ReaderFor<capnp::AnyStruct> *)&_kjCondition,(Reader *)&sb);
    local_31c = (uint)local_284;
    kj::_::Debug::log<char_const(&)[110],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"(20) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size())\", _kjCondition, 20, root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size()"
               ,(char (*) [110])
                "failed: expected (20) == (root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size())"
               ,&_kjCondition_2,(int *)&local_380,&local_31c);
  }
  _kjCondition_2._0_8_ = root._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_2.op.content.size_ = (size_t)root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)&_kjCondition,
             (Builder *)&_kjCondition_2);
  uVar10 = local_288 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar10;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b08b;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_288 = CONCAT31(local_288._1_3_,uVar10 == 0x30);
  if (kj::_::Debug::minSeverity < 3 && uVar10 != 0x30) {
    sb._builder.segment._0_4_ = 0x30;
    _kjCondition_2._0_8_ = _kjCondition.op.content.ptr;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x82,ERROR,
               "\"failed: expected \" \"(48) == (b.getDataSection().size())\", _kjCondition, 48, b.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (b.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,(int *)&sb,
               (unsigned_long *)&_kjCondition_2);
  }
  _kjCondition.right._0_2_ = local_284;
  _kjCondition.left = 0x14;
  _kjCondition.right._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = local_284 == 0x14;
  if ((local_284 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 0x14;
    sb._builder.segment._0_4_ = (uint)local_284;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x83,ERROR,
               "\"failed: expected \" \"(20) == (b.getPointerSection().size())\", _kjCondition, 20, b.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (b.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,&_kjCondition_2.left,(uint *)&sb)
    ;
  }
  _kjCondition_2._0_8_ = root._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_2.op.content.size_ = (size_t)root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)&_kjCondition,
             (Builder *)&_kjCondition_2);
  uVar8 = _kjCondition._24_8_;
  pcVar4 = _kjCondition.op.content.ptr;
  uVar1 = _kjCondition._0_8_;
  uVar10 = local_288 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar10;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b08b;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_288 = CONCAT31(local_288._1_3_,uVar10 == 0x30);
  if (kj::_::Debug::minSeverity < 3 && uVar10 != 0x30) {
    sb._builder.segment._0_4_ = 0x30;
    _kjCondition_2._0_8_ = _kjCondition.op.content.ptr;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x87,ERROR,
               "\"failed: expected \" \"(48) == (b.getDataSection().size())\", _kjCondition, 48, b.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (b.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,(int *)&sb,
               (unsigned_long *)&_kjCondition_2);
  }
  _kjCondition.left = 0x14;
  _kjCondition.right._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = local_284 == 0x14;
  if ((local_284 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 0x14;
    sb._builder.segment._0_4_ = (uint)local_284;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x88,ERROR,
               "\"failed: expected \" \"(20) == (b.getPointerSection().size())\", _kjCondition, 20, b.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (b.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,&_kjCondition_2.left,(uint *)&sb)
    ;
  }
  sb._builder.capTable = root._builder.capTable;
  sb._builder.segment = root._builder.segment;
  sb._builder.data = root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)&_kjCondition_2,(Builder *)&sb
            );
  StructBuilder::asReader((StructBuilder *)&_kjCondition_2);
  uVar10 = local_288 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar10;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b08b;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_288 = CONCAT31(local_288._1_3_,uVar10 == 0x30);
  if (kj::_::Debug::minSeverity < 3 && uVar10 != 0x30) {
    sb._builder.segment._0_4_ = 0x30;
    _kjCondition_2._0_8_ = _kjCondition.op.content.ptr;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x8c,ERROR,
               "\"failed: expected \" \"(48) == (r.getDataSection().size())\", _kjCondition, 48, r.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (r.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,(int *)&sb,
               (unsigned_long *)&_kjCondition_2);
  }
  _kjCondition.left = 0x14;
  _kjCondition.right._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = local_284 == 0x14;
  if ((local_284 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 0x14;
    sb._builder.segment._0_4_ = (uint)local_284;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x8d,ERROR,
               "\"failed: expected \" \"(20) == (r.getPointerSection().size())\", _kjCondition, 20, r.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (r.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,(int *)&_kjCondition_2,
               (uint *)&sb);
  }
  _kjCondition_15.op.content.ptr = (char *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)&sb,
             (Builder *)&_kjCondition_15);
  _kjCondition_2._28_4_ = sb._builder.pointers._4_4_;
  _kjCondition_2._24_4_ = sb._builder.pointers._0_4_;
  _kjCondition_2.op.content.size_ = (size_t)sb._builder.data;
  _kjCondition_2._0_8_ = sb._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)sb._builder.capTable;
  StructBuilder::asReader((StructBuilder *)&_kjCondition_2);
  uVar10 = local_288 >> 3;
  _kjCondition.op.content.ptr = (char *)(ulong)uVar10;
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b08b;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  local_288 = CONCAT31(local_288._1_3_,uVar10 == 0x30);
  if (kj::_::Debug::minSeverity < 3 && uVar10 != 0x30) {
    sb._builder.segment._0_4_ = 0x30;
    _kjCondition_2._0_8_ = _kjCondition.op.content.ptr;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(48) == (r.getDataSection().size())\", _kjCondition, 48, r.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (r.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,(int *)&sb,
               (unsigned_long *)&_kjCondition_2);
  }
  _kjCondition.left = 0x14;
  _kjCondition.right._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = local_284 == 0x14;
  if ((local_284 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 0x14;
    sb._builder.segment._0_4_ = (uint)local_284;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(20) == (r.getPointerSection().size())\", _kjCondition, 20, r.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (r.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,(int *)&_kjCondition_2,
               (uint *)&sb);
  }
  sb._builder.capTable = root._builder.capTable;
  sb._builder.segment = root._builder.segment;
  sb._builder.data = root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)&_kjCondition_2,(Builder *)&sb
            );
  StructBuilder::asReader((StructBuilder *)&_kjCondition_2);
  uVar9 = _kjCondition._24_8_;
  sVar6 = _kjCondition.op.content.size_;
  pcVar5 = _kjCondition.op.content.ptr;
  uVar2 = _kjCondition._0_8_;
  __n = (char *)(ulong)(local_288 >> 3);
  _kjCondition.left = 0x30;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b08b;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (kj::_::Debug::minSeverity < 3 && local_288 >> 3 != 0x30) {
    sb._builder.segment._0_4_ = 0x30;
    _kjCondition_2._0_8_ = __n;
    _kjCondition.op.content.ptr = __n;
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x95,ERROR,
               "\"failed: expected \" \"(48) == (r.getDataSection().size())\", _kjCondition, 48, r.getDataSection().size()"
               ,(char (*) [53])"failed: expected (48) == (r.getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition,(int *)&sb,
               (unsigned_long *)&_kjCondition_2);
  }
  _kjCondition.left = 0x14;
  _kjCondition.right._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = local_284 == 0x14;
  if ((local_284 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 0x14;
    sb._builder.segment._0_4_ = (uint)local_284;
    kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x96,ERROR,
               "\"failed: expected \" \"(20) == (r.getPointerSection().size())\", _kjCondition, 20, r.getPointerSection().size()"
               ,(char (*) [56])"failed: expected (20) == (r.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition,(int *)&_kjCondition_2,
               (uint *)&sb);
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&_kjCondition,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)&_kjCondition_2,(MessageBuilder *)&_kjCondition);
  _kjCondition_15.right = (unsigned_long)_kjCondition_2.op.content.ptr;
  _kjCondition_15.left = _kjCondition_2.left;
  _kjCondition_15._4_4_ = _kjCondition_2.right;
  _kjCondition_15.op.content.ptr = (char *)_kjCondition_2._24_8_;
  AnyPointer::Builder::initAsAnyStruct
            (&sb,(Builder *)&_kjCondition_15,(uint16_t)(local_288 >> 6),local_284);
  uVar10 = sb._builder.dataSize >> 3;
  _kjCondition_15.result = uVar10 == 0x30;
  _kjCondition_15.left = 0x30;
  _kjCondition_15.right._0_4_ = uVar10;
  _kjCondition_15.right._4_4_ = 0;
  _kjCondition_15.op.content.ptr = " == ";
  _kjCondition_15.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_15.result) {
    local_31c = 0x30;
    local_380 = (char *)(ulong)uVar10;
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x9f,ERROR,
               "\"failed: expected \" \"(48) == (sb.getDataSection().size())\", _kjCondition, 48, sb.getDataSection().size()"
               ,(char (*) [54])"failed: expected (48) == (sb.getDataSection().size())",
               &_kjCondition_15,(int *)&local_31c,(unsigned_long *)&local_380);
  }
  _kjCondition_15._4_2_ = sb._builder.pointerCount;
  _kjCondition_15.left = 0x14;
  _kjCondition_15._6_2_ = 0;
  _kjCondition_15.right = (unsigned_long)anon_var_dwarf_b08b;
  _kjCondition_15.op.content.ptr = &DAT_00000005;
  _kjCondition_15.op.content.size_ =
       CONCAT71(_kjCondition_15.op.content.size_._1_7_,sb._builder.pointerCount == 0x14);
  if ((sb._builder.pointerCount != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_380 = (char *)CONCAT44(local_380._4_4_,0x14);
    local_31c = (uint)sb._builder.pointerCount;
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xa0,ERROR,
               "\"failed: expected \" \"(20) == (sb.getPointerSection().size())\", _kjCondition, 20, sb.getPointerSection().size()"
               ,(char (*) [57])"failed: expected (20) == (sb.getPointerSection().size())",
               (DebugComparison<int,_unsigned_int> *)&_kjCondition_15,(int *)&local_380,&local_31c);
  }
  memcpy(sb._builder.data,(void *)sVar6,(size_t)__n);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&_kjCondition);
  uVar3 = _kjCondition._0_8_;
  _kjCondition_15._0_8_ = anon_var_dwarf_aea5;
  _kjCondition.left = (int)uVar2;
  _kjCondition.right = SUB84(uVar2,4);
  _kjCondition_2.left = _kjCondition.left;
  _kjCondition_2.right = _kjCondition.right;
  _kjCondition_2.op.content.ptr = pcVar5;
  _kjCondition_2.op.content.size_ = uVar9;
  _kjCondition._0_8_ = uVar3;
  sb._builder._0_16_ = AnyPointer::Reader::getAs<capnp::Text>((Reader *)&_kjCondition_2);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_15,(Reader *)&sb);
  uVar3 = _kjCondition._0_8_;
  if ((local_280 == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left = (int)uVar2;
    _kjCondition.right = SUB84(uVar2,4);
    _kjCondition_2.left = _kjCondition.left;
    _kjCondition_2.right = _kjCondition.right;
    _kjCondition_2.op.content.ptr = pcVar5;
    _kjCondition_2.op.content.size_ = uVar9;
    _kjCondition._0_8_ = uVar3;
    sb._builder._0_16_ = AnyPointer::Reader::getAs<capnp::Text>((Reader *)&_kjCondition_2);
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xa8,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (ptrs[0].getAs<Text>())\", _kjCondition, \"foo\", ptrs[0].getAs<Text>()"
               ,(char (*) [52])"failed: expected (\"foo\") == (ptrs[0].getAs<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [4])"foo",(Reader *)&sb);
  }
  uVar3 = _kjCondition._0_8_;
  _kjCondition_15._0_8_ = "bar";
  _kjCondition.left = (int)uVar2;
  _kjCondition.right = SUB84(uVar2,4);
  _kjCondition_2.left = _kjCondition.left;
  _kjCondition_2.right = _kjCondition.right;
  _kjCondition_2.op.content.ptr = pcVar5;
  _kjCondition_2.op.content.size_ = uVar9 + 8;
  _kjCondition._0_8_ = uVar3;
  RVar15 = AnyPointer::Reader::getAs<capnp::Data>((Reader *)&_kjCondition_2);
  kj::heapString((String *)&sb,(char *)RVar15.super_ArrayPtr<const_unsigned_char>.ptr,
                 RVar15.super_ArrayPtr<const_unsigned_char>.size_);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_15,(String *)&sb);
  kj::Array<char>::~Array((Array<char> *)&sb);
  uVar3 = _kjCondition._0_8_;
  if ((local_278 == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left = (int)uVar2;
    _kjCondition.right = SUB84(uVar2,4);
    _kjCondition_2.left = _kjCondition.left;
    _kjCondition_2.right = _kjCondition.right;
    _kjCondition_2.op.content.ptr = pcVar5;
    _kjCondition_2.op.content.size_ = uVar9 + 8;
    _kjCondition._0_8_ = uVar3;
    RVar15 = AnyPointer::Reader::getAs<capnp::Data>((Reader *)&_kjCondition_2);
    kj::heapString((String *)&sb,(char *)RVar15.super_ArrayPtr<const_unsigned_char>.ptr,
                   RVar15.super_ArrayPtr<const_unsigned_char>.size_);
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xa9,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))\", _kjCondition, \"bar\", kj::heapString(ptrs[1].getAs<Data>().asChars())"
               ,(char (*) [78])
                "failed: expected (\"bar\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))",
               (DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
               (char (*) [4])0x25cb2e,(String *)&sb);
    kj::Array<char>::~Array((Array<char> *)&sb);
  }
  kj::Array<char>::~Array((Array<char> *)&_kjCondition.op);
  local_380 = "xyzzy";
  sb._builder.segment = (SegmentBuilder *)uVar2;
  sb._builder.capTable = (CapTableBuilder *)pcVar5;
  sb._builder.data = (void *)(uVar9 + 0x78);
  AnyPointer::Reader::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
            ((ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)&_kjCondition_2,(Reader *)&sb);
  _kjCondition_15._0_16_ =
       List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]((Reader *)&_kjCondition_2,1);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[6]> *)&local_380,(Reader *)&_kjCondition_15);
  if ((local_280 == false) && (kj::_::Debug::minSeverity < 3)) {
    sb._builder.segment = (SegmentBuilder *)uVar2;
    sb._builder.capTable = (CapTableBuilder *)pcVar5;
    sb._builder.data = (void *)(uVar9 + 0x78);
    AnyPointer::Reader::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
              ((ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)&_kjCondition_2,(Reader *)&sb
              );
    _kjCondition_15._0_16_ =
         List<capnp::Text,_(capnp::Kind)1>::Reader::operator[]((Reader *)&_kjCondition_2,1);
    kj::_::Debug::
    log<char_const(&)[64],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Reader>&,char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xaa,ERROR,
               "\"failed: expected \" \"(\\\"xyzzy\\\") == (ptrs[15].getAs<List<Text>>()[1])\", _kjCondition, \"xyzzy\", ptrs[15].getAs<List<Text>>()[1]"
               ,(char (*) [64])"failed: expected (\"xyzzy\") == (ptrs[15].getAs<List<Text>>()[1])",
               (DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [6])"xyzzy",(Reader *)&_kjCondition_15);
  }
  _kjCondition_15._0_8_ = anon_var_dwarf_aea5;
  sb._builder.segment = (SegmentBuilder *)uVar1;
  sb._builder.capTable = (CapTableBuilder *)pcVar4;
  sb._builder.data = (void *)uVar8;
  AnyPointer::Builder::getAs<capnp::Text>((BuilderFor<capnp::Text> *)&_kjCondition_2,(Builder *)&sb)
  ;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_15,(Builder *)&_kjCondition_2);
  if ((local_278 == false) && (kj::_::Debug::minSeverity < 3)) {
    sb._builder.segment = (SegmentBuilder *)uVar1;
    sb._builder.capTable = (CapTableBuilder *)pcVar4;
    sb._builder.data = (void *)uVar8;
    AnyPointer::Builder::getAs<capnp::Text>
              ((BuilderFor<capnp::Text> *)&_kjCondition_2,(Builder *)&sb);
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xaf,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (ptrs[0].getAs<Text>())\", _kjCondition, \"foo\", ptrs[0].getAs<Text>()"
               ,(char (*) [52])"failed: expected (\"foo\") == (ptrs[0].getAs<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [4])"foo",(Builder *)&_kjCondition_2);
  }
  _kjCondition_15._0_8_ = "bar";
  sb._builder.segment = (SegmentBuilder *)uVar1;
  sb._builder.capTable = (CapTableBuilder *)pcVar4;
  sb._builder.data = (void *)(uVar8 + 8);
  BVar16 = AnyPointer::Builder::getAs<capnp::Data>((Builder *)&sb);
  kj::heapString((String *)&_kjCondition_2,(char *)BVar16.super_ArrayPtr<unsigned_char>.ptr,
                 BVar16.super_ArrayPtr<unsigned_char>.size_);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_15,(String *)&_kjCondition_2);
  kj::Array<char>::~Array((Array<char> *)&_kjCondition_2);
  if ((local_278 == false) && (kj::_::Debug::minSeverity < 3)) {
    sb._builder.segment = (SegmentBuilder *)uVar1;
    sb._builder.capTable = (CapTableBuilder *)pcVar4;
    sb._builder.data = (void *)(uVar8 + 8);
    BVar16 = AnyPointer::Builder::getAs<capnp::Data>((Builder *)&sb);
    kj::heapString((String *)&_kjCondition_2,(char *)BVar16.super_ArrayPtr<unsigned_char>.ptr,
                   BVar16.super_ArrayPtr<unsigned_char>.size_);
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xb0,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))\", _kjCondition, \"bar\", kj::heapString(ptrs[1].getAs<Data>().asChars())"
               ,(char (*) [78])
                "failed: expected (\"bar\") == (kj::heapString(ptrs[1].getAs<Data>().asChars()))",
               (DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
               (char (*) [4])0x25cb2e,(String *)&_kjCondition_2);
    kj::Array<char>::~Array((Array<char> *)&_kjCondition_2);
  }
  kj::Array<char>::~Array((Array<char> *)&_kjCondition.op);
  uVar2 = _kjCondition._0_8_;
  local_380 = "xyzzy";
  _kjCondition.left = (int)uVar1;
  _kjCondition.right = SUB84(uVar1,4);
  _kjCondition_15.left = _kjCondition.left;
  _kjCondition_15._4_4_ = _kjCondition.right;
  _kjCondition_15.right = (unsigned_long)pcVar4;
  _kjCondition_15.op.content.ptr = (char *)(uVar8 + 0x78);
  _kjCondition._0_8_ = uVar2;
  AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
            ((BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)&_kjCondition_2,
             (Builder *)&_kjCondition_15);
  List<capnp::Text,_(capnp::Kind)1>::Builder::operator[]
            ((Builder *)&sb,(Builder *)&_kjCondition_2,1);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[6]> *)&local_380,(Builder *)&sb);
  uVar2 = _kjCondition._0_8_;
  if ((local_278 == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left = (int)uVar1;
    _kjCondition.right = SUB84(uVar1,4);
    _kjCondition_15.left = _kjCondition.left;
    _kjCondition_15._4_4_ = _kjCondition.right;
    _kjCondition_15.right = (unsigned_long)pcVar4;
    _kjCondition_15.op.content.ptr = (char *)(uVar8 + 0x78);
    _kjCondition._0_8_ = uVar2;
    AnyPointer::Builder::getAs<capnp::List<capnp::Text,(capnp::Kind)1>>
              ((BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> *)&_kjCondition_2,
               (Builder *)&_kjCondition_15);
    List<capnp::Text,_(capnp::Kind)1>::Builder::operator[]
              ((Builder *)&sb,(Builder *)&_kjCondition_2,1);
    kj::_::Debug::
    log<char_const(&)[64],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Builder>&,char_const(&)[6],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xb1,ERROR,
               "\"failed: expected \" \"(\\\"xyzzy\\\") == (ptrs[15].getAs<List<Text>>()[1])\", _kjCondition, \"xyzzy\", ptrs[15].getAs<List<Text>>()[1]"
               ,(char (*) [64])"failed: expected (\"xyzzy\") == (ptrs[15].getAs<List<Text>>()[1])",
               (DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [6])"xyzzy",(Builder *)&sb);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Any, AnyStruct) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initTestMessage(root.getAnyPointerField().initAs<TestAllTypes>());
  checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  auto allTypes = root.getAnyPointerField().getAs<AnyStruct>().as<TestAllTypes>();
  auto allTypesReader = root.getAnyPointerField().getAs<AnyStruct>().asReader().as<TestAllTypes>();
  allTypes.setInt32Field(100);
  EXPECT_EQ(100, allTypes.getInt32Field());
  EXPECT_EQ(100, allTypesReader.getInt32Field());

  EXPECT_EQ(48, root.getAnyPointerField().getAs<AnyStruct>().getDataSection().size());
  EXPECT_EQ(20, root.getAnyPointerField().getAs<AnyStruct>().getPointerSection().size());

  EXPECT_EQ(48, root.getAnyPointerField().asReader().getAs<AnyStruct>().getDataSection().size());
  EXPECT_EQ(20, root.getAnyPointerField().asReader().getAs<AnyStruct>().getPointerSection().size());

  auto b = toAny(root.getAnyPointerField().getAs<TestAllTypes>());
  EXPECT_EQ(48, b.getDataSection().size());
  EXPECT_EQ(20, b.getPointerSection().size());

#if !_MSC_VER || defined(__clang__) // TODO(msvc): ICE on the necessary constructor; see any.h.
  b = root.getAnyPointerField().getAs<TestAllTypes>();
  EXPECT_EQ(48, b.getDataSection().size());
  EXPECT_EQ(20, b.getPointerSection().size());
#endif

  auto r = toAny(root.getAnyPointerField().getAs<TestAllTypes>().asReader());
  EXPECT_EQ(48, r.getDataSection().size());
  EXPECT_EQ(20, r.getPointerSection().size());

  r = toAny(root.getAnyPointerField().getAs<TestAllTypes>()).asReader();
  EXPECT_EQ(48, r.getDataSection().size());
  EXPECT_EQ(20, r.getPointerSection().size());

#if !_MSC_VER || defined(__clang__)  // TODO(msvc): ICE on the necessary constructor; see any.h.
  r = root.getAnyPointerField().getAs<TestAllTypes>().asReader();
  EXPECT_EQ(48, r.getDataSection().size());
  EXPECT_EQ(20, r.getPointerSection().size());
#endif

  {
    MallocMessageBuilder b2;
    auto root2 = b2.getRoot<test::TestAnyPointer>();
    auto sb = root2.getAnyPointerField().initAsAnyStruct(
        r.getDataSection().size() / 8, r.getPointerSection().size());

    EXPECT_EQ(48, sb.getDataSection().size());
    EXPECT_EQ(20, sb.getPointerSection().size());

    // TODO: is there a higher-level API for this?
    memcpy(sb.getDataSection().begin(), r.getDataSection().begin(), r.getDataSection().size());
  }

  {
    auto ptrs = r.getPointerSection();
    EXPECT_EQ("foo", ptrs[0].getAs<Text>());
    EXPECT_EQ("bar", kj::heapString(ptrs[1].getAs<Data>().asChars()));
    EXPECT_EQ("xyzzy", ptrs[15].getAs<List<Text>>()[1]);
  }

  {
    auto ptrs = b.getPointerSection();
    EXPECT_EQ("foo", ptrs[0].getAs<Text>());
    EXPECT_EQ("bar", kj::heapString(ptrs[1].getAs<Data>().asChars()));
    EXPECT_EQ("xyzzy", ptrs[15].getAs<List<Text>>()[1]);
  }
}